

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Vec_Int_t * Lms_GiaFindNonRedundantCos(Lms_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *p_00;
  Vec_Int_t *p_01;
  word D1_00;
  word D2_00;
  Vec_Int_t *p_02;
  word D2;
  word D1;
  int EntryK;
  int EntryI;
  int k;
  int i;
  Vec_Wrd_t *vDelays;
  Vec_Int_t *vUseful;
  Vec_Int_t *vRemain;
  Lms_Man_t *p_local;
  
  p_00 = Lms_GiaDelays(p->pGia);
  p_01 = Lms_GiaCollectUsefulCos(p);
  EntryI = 0;
  do {
    iVar1 = Vec_IntSize(p_01);
    if (iVar1 <= EntryI) {
      p_02 = Vec_IntAlloc(1000);
      for (EntryI = 0; iVar1 = Vec_IntSize(p_01), EntryI < iVar1; EntryI = EntryI + 1) {
        iVar1 = Vec_IntEntry(p_01,EntryI);
        if (-1 < iVar1) {
          Vec_IntPush(p_02,iVar1);
        }
      }
      Vec_IntFree(p_01);
      Vec_WrdFree(p_00);
      return p_02;
    }
    iVar1 = Vec_IntEntry(p_01,EntryI);
    if (-1 < iVar1) {
      D1_00 = Vec_WrdEntry(p_00,iVar1);
      EntryK = EntryI;
      if (D1_00 == 0) {
        __assert_fail("D1 > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRec3.c"
                      ,0x4de,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
      }
      do {
        while( true ) {
          do {
            EntryK = EntryK + 1;
            iVar1 = Vec_IntSize(p_01);
            if ((iVar1 <= EntryK) || (iVar1 = Vec_IntEntry(p_01,EntryK), iVar1 == -1))
            goto LAB_0035da22;
          } while (iVar1 == -2);
          D2_00 = Vec_WrdEntry(p_00,iVar1);
          if (D2_00 == 0) {
            __assert_fail("D2 > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRec3.c"
                          ,0x4e6,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
          }
          iVar1 = Gia_ManCiNum(p->pGia);
          iVar1 = Lms_DelayDom(D1_00,D2_00,iVar1);
          if (iVar1 == 0) break;
          Vec_IntWriteEntry(p_01,EntryK,-2);
        }
        iVar1 = Gia_ManCiNum(p->pGia);
        iVar1 = Lms_DelayDom(D2_00,D1_00,iVar1);
      } while (iVar1 == 0);
      Vec_IntWriteEntry(p_01,EntryI,-2);
    }
LAB_0035da22:
    EntryI = EntryI + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Lms_GiaFindNonRedundantCos( Lms_Man_t * p )
{
    Vec_Int_t * vRemain;
    Vec_Int_t * vUseful;
    Vec_Wrd_t * vDelays;
    int i, k, EntryI, EntryK;
    word D1, D2;
    vDelays = Lms_GiaDelays( p->pGia );
    vUseful = Lms_GiaCollectUsefulCos( p );
    Vec_IntForEachEntry( vUseful, EntryI, i )
    {
        if ( EntryI < 0 )
            continue;
        D1 = Vec_WrdEntry(vDelays, EntryI);
        assert( D1 > 0 );
        Vec_IntForEachEntryStart( vUseful, EntryK, k, i+1 )
        {
            if ( EntryK == -1 )
                break;
            if ( EntryK == -2 )
                continue;
            D2 = Vec_WrdEntry(vDelays, EntryK);
            assert( D2 > 0 );
            if ( Lms_DelayDom(D1, D2, Gia_ManCiNum(p->pGia)) ) // D1 dominate D2
            {
                Vec_IntWriteEntry( vUseful, k, -2 );
                continue;
            }
            if ( Lms_DelayDom(D2, D1, Gia_ManCiNum(p->pGia)) ) // D2 dominate D1
            {
                Vec_IntWriteEntry( vUseful, i, -2 );
                break;
            }
        }
    }

    vRemain = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vUseful, EntryI, i )
        if ( EntryI >= 0 )
            Vec_IntPush( vRemain, EntryI );
    Vec_IntFree( vUseful );
    Vec_WrdFree( vDelays );
    return vRemain;
}